

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O1

void ImPlot::ShowMetricsWindow(bool *p_popen)

{
  uint uVar1;
  ImPlotPlot *pIVar2;
  ImPlotItem *pIVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ImPlotContext *pIVar7;
  bool bVar8;
  ImU32 IVar9;
  uint uVar10;
  ImGuiIO *pIVar11;
  long lVar12;
  ImGuiStyle *pIVar13;
  long lVar14;
  char *pcVar15;
  int iVar16;
  ulong uVar17;
  char *pcVar18;
  ulong uVar19;
  uint uVar20;
  float fVar21;
  ImVec4 temp;
  ImVec4 col;
  ImVec4 local_68;
  ImVec4 local_58;
  ImDrawList *local_40;
  ulong local_38;
  
  local_40 = ImGui::GetForegroundDrawList();
  pIVar7 = GImPlot;
  pIVar11 = ImGui::GetIO();
  ImGui::Begin("ImPlot Metrics",p_popen,0);
  ImGui::Text("ImPlot 0.10 WIP");
  ImGui::Text("Application average %.3f ms/frame (%.1f FPS)",
              SUB84((double)(1000.0 / pIVar11->Framerate),0),(double)pIVar11->Framerate);
  ImGui::Separator();
  bVar8 = ImGui::TreeNode("Tools");
  if (bVar8) {
    auVar4._8_8_ = 0;
    auVar4._0_4_ = local_68.z;
    auVar4._4_4_ = local_68.w;
    local_68 = (ImVec4)(auVar4 << 0x40);
    bVar8 = ImGui::Button("Bust Plot Cache",(ImVec2 *)&local_68);
    if (bVar8) {
      ImPool<ImPlotPlot>::Clear(&GImPlot->Plots);
    }
    ImGui::SameLine(0.0,-1.0);
    auVar5._8_8_ = 0;
    auVar5._0_4_ = local_68.z;
    auVar5._4_4_ = local_68.w;
    local_68 = (ImVec4)(auVar5 << 0x40);
    bVar8 = ImGui::Button("Bust Item Cache",(ImVec2 *)&local_68);
    if (bVar8) {
      BustItemCache();
    }
    ImGui::Checkbox("Show Plot Rects",&ShowMetricsWindow::show_plot_rects);
    ImGui::Checkbox("Show Axes Rects",&ShowMetricsWindow::show_axes_rects);
    ImGui::TreePop();
  }
  uVar20 = (pIVar7->Plots).Buf.Size;
  if (uVar20 != (pIVar7->Plots).Map.Data.Size) {
    pcVar15 = "int ImPool<ImPlotPlot>::GetBufSize() const [T = ImPlotPlot]";
LAB_001bf93a:
    __assert_fail("Buf.Size == Map.Data.Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_internal.h"
                  ,0x279,pcVar15);
  }
  bVar8 = ImGui::TreeNode("Plots","Plots (%d)",(ulong)uVar20);
  if (bVar8) {
    if (0 < (int)uVar20) {
      uVar19 = 0;
      do {
        if ((long)(pIVar7->Plots).Buf.Size <= (long)uVar19) {
          pcVar15 = "T &ImVector<ImPlotPlot>::operator[](int) [T = ImPlotPlot]";
LAB_001bf8e5:
          __assert_fail("i >= 0 && i < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                        ,0x68b,pcVar15);
        }
        pIVar2 = (pIVar7->Plots).Buf.Data;
        ImGui::PushID((int)uVar19);
        bVar8 = ImGui::TreeNode("Plot","Plot [ID=%u]",(ulong)pIVar2[uVar19].ID);
        uVar17 = uVar19;
        if (bVar8) {
          uVar1 = pIVar2[uVar19].Items.Buf.Size;
          if (uVar1 != pIVar2[uVar19].Items.Map.Data.Size) {
            pcVar15 = "int ImPool<ImPlotItem>::GetBufSize() const [T = ImPlotItem]";
            goto LAB_001bf93a;
          }
          bVar8 = ImGui::TreeNode("Items","Items (%d)",(ulong)uVar1);
          if (bVar8) {
            local_38 = uVar19;
            if (0 < (int)uVar1) {
              lVar14 = 0xc;
              uVar17 = 0;
              do {
                if ((long)pIVar2[uVar19].Items.Buf.Size <= (long)uVar17) {
                  pcVar15 = "T &ImVector<ImPlotItem>::operator[](int) [T = ImPlotItem]";
                  goto LAB_001bf8e5;
                }
                pIVar3 = pIVar2[uVar19].Items.Buf.Data;
                ImGui::PushID((int)uVar17);
                bVar8 = ImGui::TreeNode("Item","Item [ID=%u]",
                                        (ulong)*(uint *)((long)pIVar3 + lVar14 + -0xc));
                if (bVar8) {
                  ImGui::Bullet();
                  ImGui::Checkbox("Show",(bool *)((long)&pIVar3->ID + lVar14));
                  ImGui::Bullet();
                  local_68 = ImGui::ColorConvertU32ToFloat4(*(ImU32 *)((long)pIVar3 + lVar14 + -8));
                  bVar8 = ImGui::ColorEdit4("Color",&local_68.x,0x20);
                  if (bVar8) {
                    IVar9 = ImGui::ColorConvertFloat4ToU32(&local_68);
                    *(ImU32 *)((long)pIVar3 + lVar14 + -8) = IVar9;
                  }
                  ImGui::Bullet();
                  ImGui::Text("NameOffset: %d",(ulong)*(uint *)((long)pIVar3 + lVar14 + -4));
                  ImGui::Bullet();
                  lVar12 = (long)*(int *)((long)pIVar3 + lVar14 + -4);
                  pcVar15 = "N/A";
                  if (lVar12 != -1) {
                    pcVar15 = pIVar2[uVar19].LegendData.Labels.Buf.Data + lVar12;
                  }
                  ImGui::Text("Name: %s",pcVar15);
                  ImGui::Bullet();
                  pcVar15 = "false";
                  if (*(char *)((long)&pIVar3->ID + lVar14 + 1) != '\0') {
                    pcVar15 = "true";
                  }
                  ImGui::Text("Hovered: %s",pcVar15);
                  ImGui::TreePop();
                }
                ImGui::PopID();
                uVar17 = uVar17 + 1;
                lVar14 = lVar14 + 0x10;
              } while (uVar1 != uVar17);
            }
            ImGui::TreePop();
            uVar17 = local_38;
          }
          bVar8 = ImGui::TreeNode("X-Axis");
          if (bVar8) {
            ShowAxisMetrics(&pIVar2[uVar19].XAxis,ShowMetricsWindow::show_axes_rects);
            ImGui::TreePop();
          }
          bVar8 = ImGui::TreeNode("Y-Axis");
          if (bVar8) {
            ShowAxisMetrics(pIVar2[uVar19].YAxis,ShowMetricsWindow::show_axes_rects);
            ImGui::TreePop();
          }
          if ((pIVar2[uVar19].Flags & 0x100) != 0) {
            bVar8 = ImGui::TreeNode("Y-Axis 2");
            if (bVar8) {
              ShowAxisMetrics(pIVar2[uVar19].YAxis + 1,ShowMetricsWindow::show_axes_rects);
              ImGui::TreePop();
            }
          }
          if ((pIVar2[uVar19].Flags & 0x200) != 0) {
            bVar8 = ImGui::TreeNode("Y-Axis 3");
            if (bVar8) {
              ShowAxisMetrics(pIVar2[uVar19].YAxis + 2,ShowMetricsWindow::show_axes_rects);
              ImGui::TreePop();
            }
          }
          ImGui::Bullet();
          ImGui::Text("Flags: %d",(ulong)(uint)pIVar2[uVar19].Flags);
          ImGui::Bullet();
          pcVar18 = "false";
          pcVar15 = "false";
          if (pIVar2[uVar19].Initialized != false) {
            pcVar15 = "true";
          }
          ImGui::Text("Initialized: %s",pcVar15);
          ImGui::Bullet();
          pcVar15 = "false";
          if (pIVar2[uVar19].Selecting != false) {
            pcVar15 = "true";
          }
          ImGui::Text("Selecting: %s",pcVar15);
          ImGui::Bullet();
          pcVar15 = "false";
          if (pIVar2[uVar19].Selected != false) {
            pcVar15 = "true";
          }
          ImGui::Text("Selected: %s",pcVar15);
          ImGui::Bullet();
          pcVar15 = "false";
          if (pIVar2[uVar19].Querying != false) {
            pcVar15 = "true";
          }
          ImGui::Text("Querying: %s",pcVar15);
          ImGui::Bullet();
          pcVar15 = "false";
          if (pIVar2[uVar19].Queried != false) {
            pcVar15 = "true";
          }
          ImGui::Text("Queried: %s",pcVar15);
          ImGui::Bullet();
          pcVar15 = "false";
          if (pIVar2[uVar19].FrameHovered != false) {
            pcVar15 = "true";
          }
          ImGui::Text("FrameHovered: %s",pcVar15);
          ImGui::Bullet();
          pcVar15 = "false";
          if (pIVar2[uVar19].PlotHovered != false) {
            pcVar15 = "true";
          }
          ImGui::Text("PlotHovered: %s",pcVar15);
          ImGui::Bullet();
          if (pIVar2[uVar19].LegendHovered != false) {
            pcVar18 = "true";
          }
          ImGui::Text("LegendHovered: %s",pcVar18);
          ImGui::TreePop();
          if (ShowMetricsWindow::show_plot_rects == true) {
            ImDrawList::AddRect(local_40,&pIVar2[uVar19].PlotRect.Min,&pIVar2[uVar19].PlotRect.Max,
                                0xff00ffff,0.0,0,1.0);
          }
        }
        ImGui::PopID();
        uVar19 = uVar17 + 1;
      } while (uVar19 != uVar20);
    }
    ImGui::TreePop();
  }
  bVar8 = ImGui::TreeNode("Colormaps");
  if (bVar8) {
    ImGui::BulletText("Colormaps:  %d",(ulong)(uint)(pIVar7->ColormapData).Count);
    ImGui::BulletText("Memory: %d bytes",(ulong)(uint)((pIVar7->ColormapData).Tables.Size << 2));
    bVar8 = ImGui::TreeNode("Data");
    if (bVar8) {
      if (0 < (pIVar7->ColormapData).Count) {
        iVar16 = 0;
        lVar14 = 0;
        do {
          if (lVar14 < (pIVar7->ColormapData).Count) {
            if (lVar14 < (pIVar7->ColormapData).TextOffsets.Size) {
              pcVar15 = (pIVar7->ColormapData).Text.Buf.Data +
                        (pIVar7->ColormapData).TextOffsets.Data[lVar14];
              goto LAB_001bf65e;
            }
LAB_001bf8b9:
            pcVar15 = "const T &ImVector<int>::operator[](int) const [T = int]";
LAB_001bf904:
            __assert_fail("i >= 0 && i < Size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                          ,0x68c,pcVar15);
          }
          pcVar15 = (char *)0x0;
LAB_001bf65e:
          bVar8 = ImGui::TreeNode(pcVar15);
          if (bVar8) {
            if (((pIVar7->ColormapData).KeyCounts.Size <= lVar14) ||
               ((pIVar7->ColormapData).TableSizes.Size <= lVar14)) goto LAB_001bf8b9;
            if ((pIVar7->ColormapData).Quals.Size <= lVar14) {
              pcVar15 = "const T &ImVector<bool>::operator[](int) const [T = bool]";
              goto LAB_001bf904;
            }
            uVar20 = (pIVar7->ColormapData).KeyCounts.Data[lVar14];
            uVar1 = (pIVar7->ColormapData).TableSizes.Data[lVar14];
            pcVar15 = "false";
            if ((pIVar7->ColormapData).Quals.Data[lVar14] != false) {
              pcVar15 = "true";
            }
            ImGui::BulletText("Qualitative: %s",pcVar15);
            ImGui::BulletText("Key Count: %d",(ulong)uVar20);
            ImGui::BulletText("Table Size: %d",(ulong)uVar1);
            ImGui::Indent(0.0);
            local_68 = (ImVec4)ZEXT816(0);
            fVar21 = ImGui::GetFrameHeight();
            pIVar13 = ImGui::GetStyle();
            ImGui::SetNextItemWidth((320.0 - fVar21) - (pIVar13->ItemSpacing).x);
            ColormapSlider("##Sample",&ShowMetricsWindow::t,&local_68,"%.3f",(ImPlotColormap)lVar14)
            ;
            ImGui::SameLine(0.0,-1.0);
            ImGui::ColorButton("Sampler",&local_68,0,(ImVec2)0x0);
            local_58 = (ImVec4)ZEXT816(0);
            ImGui::PushStyleColor(7,&local_58);
            auVar6._8_8_ = 0;
            auVar6._0_4_ = local_58.z;
            auVar6._4_4_ = local_58.w;
            local_58 = (ImVec4)(auVar6 << 0x40);
            ImGui::PushStyleVar(0xd,(ImVec2 *)&local_58);
            if (0 < (int)uVar1) {
              uVar20 = 0;
              do {
                if ((pIVar7->ColormapData).TableOffsets.Size <= lVar14) goto LAB_001bf8b9;
                uVar10 = (pIVar7->ColormapData).TableOffsets.Data[lVar14] + uVar20;
                if (((int)uVar10 < 0) || ((pIVar7->ColormapData).Tables.Size <= (int)uVar10)) {
                  pcVar15 = 
                  "const T &ImVector<unsigned int>::operator[](int) const [T = unsigned int]";
                  goto LAB_001bf904;
                }
                local_58 = ImGui::ColorConvertU32ToFloat4
                                     ((pIVar7->ColormapData).Tables.Data[uVar10]);
                ImGui::PushID(iVar16 + uVar20);
                ImGui::ColorButton("",&local_58,0,(ImVec2)0x4120000041200000);
                ImGui::PopID();
                uVar10 = uVar20 + 1;
                if (((uVar10 & 0x1f) != 0) && (uVar20 - uVar1 != -1)) {
                  ImGui::SameLine(0.0,-1.0);
                }
                uVar20 = uVar10;
              } while (uVar10 != uVar1);
            }
            ImGui::PopStyleVar(1);
            ImGui::PopStyleColor(1);
            ImGui::Unindent(0.0);
            ImGui::TreePop();
          }
          lVar14 = lVar14 + 1;
          iVar16 = iVar16 + 1000;
        } while (lVar14 < (pIVar7->ColormapData).Count);
      }
      ImGui::TreePop();
    }
    ImGui::TreePop();
  }
  ImGui::End();
  return;
}

Assistant:

void ShowMetricsWindow(bool* p_popen) {

    static bool show_plot_rects = false;
    static bool show_axes_rects = false;

    ImDrawList& fg = *ImGui::GetForegroundDrawList();

    ImPlotContext& gp = *GImPlot;
    // ImGuiContext& g = *GImGui;
    ImGuiIO& io = ImGui::GetIO();
    ImGui::Begin("ImPlot Metrics", p_popen);
    ImGui::Text("ImPlot " IMPLOT_VERSION);
    ImGui::Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / io.Framerate, io.Framerate);
    ImGui::Separator();
    if (ImGui::TreeNode("Tools")) {
        if (ImGui::Button("Bust Plot Cache"))
            BustPlotCache();
        ImGui::SameLine();
        if (ImGui::Button("Bust Item Cache"))
            BustItemCache();
        ImGui::Checkbox("Show Plot Rects", &show_plot_rects);
        ImGui::Checkbox("Show Axes Rects", &show_axes_rects);
        ImGui::TreePop();
    }
    const int n_plots = gp.Plots.GetBufSize();
    if (ImGui::TreeNode("Plots","Plots (%d)", n_plots)) {
        for (int p = 0; p < n_plots; ++p) {
            // plot
            ImPlotPlot* plot = gp.Plots.GetByIndex(p);
            ImGui::PushID(p);
            if (ImGui::TreeNode("Plot", "Plot [ID=%u]", plot->ID)) {
                int n_items = plot->Items.GetBufSize();
                if (ImGui::TreeNode("Items", "Items (%d)", n_items)) {
                    for (int i = 0; i < n_items; ++i) {
                        ImPlotItem* item = plot->Items.GetByIndex(i);
                        ImGui::PushID(i);
                        if (ImGui::TreeNode("Item", "Item [ID=%u]", item->ID)) {
                            ImGui::Bullet(); ImGui::Checkbox("Show", &item->Show);
                            ImGui::Bullet();
                            ImVec4 temp = ImGui::ColorConvertU32ToFloat4(item->Color);
                            if (ImGui::ColorEdit4("Color",&temp.x, ImGuiColorEditFlags_NoInputs))
                                item->Color = ImGui::ColorConvertFloat4ToU32(temp);

                            ImGui::Bullet(); ImGui::Text("NameOffset: %d",item->NameOffset);
                            ImGui::Bullet(); ImGui::Text("Name: %s", item->NameOffset != -1 ? plot->LegendData.Labels.Buf.Data + item->NameOffset : "N/A");
                            ImGui::Bullet(); ImGui::Text("Hovered: %s",item->LegendHovered ? "true" : "false");
                            ImGui::TreePop();
                        }
                        ImGui::PopID();
                    }
                    ImGui::TreePop();
                }
                if (ImGui::TreeNode("X-Axis")) {
                    ShowAxisMetrics(&plot->XAxis, show_axes_rects);
                    ImGui::TreePop();
                }
                if (ImGui::TreeNode("Y-Axis")) {
                    ShowAxisMetrics(&plot->YAxis[0], show_axes_rects);
                    ImGui::TreePop();
                }
                if (ImHasFlag(plot->Flags, ImPlotFlags_YAxis2) && ImGui::TreeNode("Y-Axis 2")) {
                    ShowAxisMetrics(&plot->YAxis[1], show_axes_rects);
                    ImGui::TreePop();
                }
                if (ImHasFlag(plot->Flags, ImPlotFlags_YAxis3) && ImGui::TreeNode("Y-Axis 3")) {
                    ShowAxisMetrics(&plot->YAxis[2], show_axes_rects);
                    ImGui::TreePop();
                }
                ImGui::Bullet(); ImGui::Text("Flags: %d", plot->Flags);
                ImGui::Bullet(); ImGui::Text("Initialized: %s", plot->Initialized ? "true" : "false");
                ImGui::Bullet(); ImGui::Text("Selecting: %s", plot->Selecting ? "true" : "false");
                ImGui::Bullet(); ImGui::Text("Selected: %s", plot->Selected ? "true" : "false");
                ImGui::Bullet(); ImGui::Text("Querying: %s", plot->Querying ? "true" : "false");
                ImGui::Bullet(); ImGui::Text("Queried: %s", plot->Queried ? "true" : "false");
                ImGui::Bullet(); ImGui::Text("FrameHovered: %s", plot->FrameHovered ? "true" : "false");
                ImGui::Bullet(); ImGui::Text("PlotHovered: %s", plot->PlotHovered ? "true" : "false");
                ImGui::Bullet(); ImGui::Text("LegendHovered: %s", plot->LegendHovered ? "true" : "false");
                ImGui::TreePop();
                if (show_plot_rects)
                    fg.AddRect(plot->PlotRect.Min, plot->PlotRect.Max, IM_COL32(255,255,0,255));
            }
            ImGui::PopID();
        }
        ImGui::TreePop();
    }
    if (ImGui::TreeNode("Colormaps")) {
        ImGui::BulletText("Colormaps:  %d", gp.ColormapData.Count);
        ImGui::BulletText("Memory: %d bytes", gp.ColormapData.Tables.Size * 4);
        if (ImGui::TreeNode("Data")) {
            for (int m = 0; m < gp.ColormapData.Count; ++m) {
                if (ImGui::TreeNode(gp.ColormapData.GetName(m))) {
                    int count = gp.ColormapData.GetKeyCount(m);
                    int size = gp.ColormapData.GetTableSize(m);
                    bool qual = gp.ColormapData.IsQual(m);
                    ImGui::BulletText("Qualitative: %s", qual ? "true" : "false");
                    ImGui::BulletText("Key Count: %d", count);
                    ImGui::BulletText("Table Size: %d", size);
                    ImGui::Indent();

                    static float t = 0.5;
                    ImVec4 samp;
                    float wid = 32 * 10 - ImGui::GetFrameHeight() - ImGui::GetStyle().ItemSpacing.x;
                    ImGui::SetNextItemWidth(wid);
                    ImPlot::ColormapSlider("##Sample",&t,&samp,"%.3f",m);
                    ImGui::SameLine();
                    ImGui::ColorButton("Sampler",samp);
                    ImGui::PushStyleColor(ImGuiCol_FrameBg, ImVec4(0,0,0,0));
                    ImGui::PushStyleVar(ImGuiStyleVar_ItemSpacing, ImVec2(0,0));
                    for (int c = 0; c < size; ++c) {
                        ImVec4 col = ImGui::ColorConvertU32ToFloat4(gp.ColormapData.GetTableColor(m,c));
                        ImGui::PushID(m*1000+c);
                        ImGui::ColorButton("",col,0,ImVec2(10,10));
                        ImGui::PopID();
                        if ((c + 1) % 32 != 0 && c != size - 1)
                            ImGui::SameLine();
                    }
                    ImGui::PopStyleVar();
                    ImGui::PopStyleColor();
                    ImGui::Unindent();
                    ImGui::TreePop();
                }
            }
            ImGui::TreePop();
        }
        ImGui::TreePop();
    }
    ImGui::End();
}